

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void BasicSignalTests::run(void)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  socklen_t in_ECX;
  socklen_t sVar3;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  char *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_class_1_0_00000001 local_1e9;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  local_1e8;
  anon_class_1_0_00000001 local_1c1;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  local_1c0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  local_1a0;
  ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
  local_180;
  Signal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
  sig2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  code *local_150;
  undefined8 local_148;
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_140;
  code *local_120;
  undefined8 local_118;
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_110;
  Simple local_eb;
  undefined1 local_ea;
  allocator<char> local_e9;
  undefined1 local_e8 [5];
  Foo foo;
  bool success;
  anon_class_1_0_00000001 local_c1;
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_c0;
  size_t local_a0;
  size_t id3;
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_90;
  size_t local_70;
  size_t id2;
  size_t local_48;
  size_t id1;
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_30;
  ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
  local_10;
  Signal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
  sig1;
  
  std::__cxx11::string::operator=((string *)&accu_abi_cxx11_,"");
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_30);
  Simple::
  Signal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
  ::Signal((Signal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
            *)&local_10,&local_30);
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_30);
  std::function<char(float,int,std::__cxx11::string)>::
  function<char(&)(float,int,std::__cxx11::string),void>
            ((function<char(float,int,std::__cxx11::string)> *)&id2,float_callback);
  iVar2 = Simple::Lib::
          ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
          ::connect(&local_10,(int)(function<char(float,int,std::__cxx11::string)> *)&id2,__addr,
                    in_ECX);
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&id2);
  local_48 = CONCAT44(extraout_var,iVar2);
  std::function<char(float,int,std::__cxx11::string)>::
  function<BasicSignalTests::run()::_lambda(float,int,std::__cxx11::string)_1_,void>
            ((function<char(float,int,std::__cxx11::string)> *)&local_90,
             (anon_class_1_0_00000001 *)((long)&id3 + 7));
  iVar2 = Simple::Lib::
          ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
          ::connect(&local_10,(int)&local_90,__addr_00,in_ECX);
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_90);
  local_70 = CONCAT44(extraout_var_00,iVar2);
  std::function<char(float,int,std::__cxx11::string)>::
  function<BasicSignalTests::run()::_lambda(float,int,std::__cxx11::string_const&)_1_,void>
            ((function<char(float,int,std::__cxx11::string)> *)&local_c0,&local_c1);
  iVar2 = Simple::Lib::
          ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
          ::connect(&local_10,(int)&local_c0,__addr_01,in_ECX);
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_c0);
  local_a0 = CONCAT44(extraout_var_01,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"huhu",&local_e9);
  Simple::Lib::
  ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
  ::emit(&local_10,0.3,4,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_ea = Simple::Lib::
             ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             ::disconnect(&local_10,local_48);
  if (!(bool)local_ea) {
    __assert_fail("success == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x53,"static void BasicSignalTests::run()");
  }
  local_ea = Simple::Lib::
             ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             ::disconnect(&local_10,local_48);
  if ((bool)local_ea) {
    __assert_fail("success == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x54,"static void BasicSignalTests::run()");
  }
  local_ea = Simple::Lib::
             ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             ::disconnect(&local_10,local_70);
  if (!(bool)local_ea) {
    __assert_fail("success == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x55,"static void BasicSignalTests::run()");
  }
  local_ea = Simple::Lib::
             ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             ::disconnect(&local_10,local_a0);
  if ((bool)local_ea) {
    local_ea = Simple::Lib::
               ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
               ::disconnect(&local_10,local_a0);
    if ((bool)local_ea) {
      __assert_fail("success == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                    ,0x57,"static void BasicSignalTests::run()");
    }
    local_ea = Simple::Lib::
               ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
               ::disconnect(&local_10,local_70);
    if (!(bool)local_ea) {
      local_120 = Foo::foo_bool;
      local_118 = 0;
      sVar3 = 0;
      Simple::slot<BasicSignalTests::Foo,BasicSignalTests::Foo,char,float,int,std::__cxx11::string>
                (&local_110,&local_eb,(Foo *)Foo::foo_bool,0);
      Simple::Lib::
      ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
      ::connect(&local_10,(int)&local_110,__addr_02,sVar3);
      std::
      function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function(&local_110);
      local_150 = Foo::foo_bool;
      local_148 = 0;
      sVar3 = 0;
      Simple::slot<BasicSignalTests::Foo,char,float,int,std::__cxx11::string>
                (&local_140,&local_eb,(Foo *)Foo::foo_bool,0);
      Simple::Lib::
      ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
      ::connect(&local_10,(int)&local_140,__addr_03,sVar3);
      std::
      function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function(&local_140);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"12",
                 (allocator<char> *)
                 ((long)&sig2.
                         super_ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
                         .callback_ring_ + 7));
      Simple::Lib::
      ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
      ::emit(&local_10,0.5,1,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&sig2.
                         super_ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
                         .callback_ring_ + 7));
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
      ::function(&local_1a0);
      Simple::
      Signal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
      ::Signal((Signal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
                *)&local_180,&local_1a0);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
      ::~function(&local_1a0);
      std::function<void(std::__cxx11::string,int)>::
      function<BasicSignalTests::run()::_lambda(std::__cxx11::string,int)_1_,void>
                ((function<void(std::__cxx11::string,int)> *)&local_1c0,&local_1c1);
      Simple::Lib::
      ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
      ::connect(&local_180,(int)&local_1c0,__addr_04,sVar3);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
      ::~function(&local_1c0);
      std::function<void(std::__cxx11::string,int)>::
      function<BasicSignalTests::run()::_lambda(std::__cxx11::string,int)_2_,void>
                ((function<void(std::__cxx11::string,int)> *)&local_1e8,&local_1e9);
      Simple::Lib::
      ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
      ::connect(&local_180,(int)&local_1e8,__addr_05,sVar3);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
      ::~function(&local_1e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"in sig2",(allocator<char> *)((long)&expected + 7));
      Simple::Lib::
      ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
      ::emit(&local_180,&local_210,0x11);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)((long)&expected + 7));
      std::__cxx11::string::operator+=((string *)&accu_abi_cxx11_,"DONE");
      bVar1 = std::operator==(&accu_abi_cxx11_,
                              "float: 0.30\nint: 4\nstring: huhu\nFoo: 3.50\nFoo: 3.50\nmsg: in sig2 *17*\nDONE"
                             );
      if (!bVar1) {
        __assert_fail("accu == expected",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                      ,0x6d,"static void BasicSignalTests::run()");
      }
      Simple::
      Signal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
      ::~Signal((Signal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
                 *)&local_180);
      Simple::
      Signal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
      ::~Signal((Signal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
                 *)&local_10);
      return;
    }
    __assert_fail("success == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x58,"static void BasicSignalTests::run()");
  }
  __assert_fail("success == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                ,0x56,"static void BasicSignalTests::run()");
}

Assistant:

static void
  run()
  {
    accu = "";
    Simple::Signal<char (float, int, std::string)> sig1;
      
    size_t id1 = sig1.connect(float_callback);
      
    size_t id2 = sig1.connect([] (float, int i, std::string) {
                                    accu += string_printf ("int: %d\n", i); return 0;
                              });
    
    size_t id3 = sig1.connect([] (float, int, const std::string &s) {
                                    accu += string_printf ("string: %s\n", s.c_str()); return 0;
                              });
    sig1.emit (.3, 4, "huhu");
      
    bool success;
    success = sig1.disconnect(id1); assert (success == true);
    success = sig1.disconnect(id1); assert (success == false);
    success = sig1.disconnect(id2); assert (success == true);
    success = sig1.disconnect(id3); assert (success == true);
    success = sig1.disconnect(id3); assert (success == false);
    success = sig1.disconnect(id2); assert (success == false);
    Foo foo;
    sig1.connect(Simple::slot (foo, &Foo::foo_bool));
    sig1.connect(Simple::slot (&foo, &Foo::foo_bool));
    sig1.emit (.5, 1, "12");

    Simple::Signal<void (std::string, int)> sig2;
    sig2.connect([] (std::string msg, int) { accu += string_printf ("msg: %s", msg.c_str()); });
    sig2.connect([] (std::string, int d)   { accu += string_printf (" *%d*\n", d); });
    sig2.emit ("in sig2", 17);

    accu += "DONE";

    const char *expected =
      "float: 0.30\n"
      "int: 4\n"
      "string: huhu\n"
      "Foo: 3.50\n"
      "Foo: 3.50\n"
      "msg: in sig2 *17*\n"
      "DONE";
    assert (accu == expected);
  }